

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

long test_output_only_noop_data_cb
               (cubeb_stream *param_1,void *param_2,void *input_buffer,void *output_buffer,
               long frame_count)

{
  bool bVar1;
  byte bVar2;
  long in_RDX;
  long in_R8;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  void **in_stack_ffffffffffffff48;
  AssertionResult *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  Type in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  AssertionResult local_78;
  string local_68 [24];
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  AssertionResult *in_stack_ffffffffffffffc8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffd0;
  
  testing::AssertionResult::AssertionResult<void*>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(type *)0x10f248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffd0._M_head_impl,
               (Message *)in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
    std::__cxx11::string::~string(local_68);
    testing::Message::~Message((Message *)0x10f2e6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f2f3);
  bVar2 = (in_RDX != 0 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_ffffffffffffff50,(bool *)in_stack_ffffffffffffff48,(type *)0x10f31a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT17(bVar2,in_stack_ffffffffffffff80));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(bVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffd0._M_head_impl,
               (Message *)in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    testing::Message::~Message((Message *)0x10f3b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f3bc);
  return in_R8;
}

Assistant:

long
test_output_only_noop_data_cb(cubeb_stream * /*stm*/, void * /*user_ptr*/,
                              const void * input_buffer, void * output_buffer,
                              long frame_count)
{
  EXPECT_TRUE(output_buffer);
  EXPECT_TRUE(!input_buffer);
  return frame_count;
}